

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_SetGoal(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  TObjPtr<AActor> *obj;
  AActor *pAVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  int iVar5;
  FName local_5c;
  TActorIterator<AActor> selfiterator;
  NActorIterator goaliterator;
  
  selfiterator.super_FActorIterator.base = (AActor *)0x0;
  goaliterator.super_FActorIterator.base = (AActor *)0x0;
  local_5c.Index = 0x105;
  selfiterator.super_FActorIterator.id = arg0;
  goaliterator.super_FActorIterator.id = arg1;
  goaliterator.type = PClass::FindClass(&local_5c);
  pAVar1 = NActorIterator::Next(&goaliterator);
  iVar5 = 0;
  while( true ) {
    pAVar2 = TActorIterator<AActor>::Next(&selfiterator);
    if (pAVar2 == (AActor *)0x0) break;
    iVar5 = 1;
    if (((pAVar2->flags).Value & 4) != 0) {
      obj = &pAVar2->target;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)&pAVar2->goal);
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (pAVar4 == pAVar3) {
        (obj->field_0).p = (AActor *)0x0;
      }
      (pAVar2->goal).field_0.p = pAVar1;
      (pAVar2->flags5).Value = (pAVar2->flags5).Value & 0xffffff7f | (uint)(arg3 != 0) << 7;
      pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
      if (pAVar3 == (AActor *)0x0) {
        pAVar2->reactiontime = arg2 * 0x23;
      }
    }
  }
  return iVar5;
}

Assistant:

FUNC(LS_Thing_SetGoal)
// Thing_SetGoal (tid, goal, delay, chasegoal)
{
	TActorIterator<AActor> selfiterator (arg0);
	NActorIterator goaliterator (NAME_PatrolPoint, arg1);
	AActor *self;
	AActor *goal = goaliterator.Next ();
	bool ok = false;

	while ( (self = selfiterator.Next ()) )
	{
		ok = true;
		if (self->flags & MF_SHOOTABLE)
		{
			if (self->target == self->goal)
			{ // Targeting a goal already? -> don't target it anymore.
			  // A_Look will set it to the goal, presuming no real targets
			  // come into view by then.
				self->target = NULL;
			}
			self->goal = goal;
			if (arg3 == 0)
			{
				self->flags5 &= ~MF5_CHASEGOAL;
			}
			else
			{
				self->flags5 |= MF5_CHASEGOAL;
			}
			if (self->target == NULL)
			{
				self->reactiontime = arg2 * TICRATE;
			}
		}
	}

	return ok;
}